

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::TestacceptorFixturenextSequenceReset::RunImpl
          (TestacceptorFixturenextSequenceReset *this)

{
  TestDetails *details;
  acceptorFixturenextSequenceResetHelper fixtureHelper;
  acceptorFixturenextSequenceResetHelper local_660;
  
  details = &(this->super_Test).m_details;
  sessionFixture::sessionFixture((sessionFixture *)&local_660,0);
  local_660.super_acceptorFixture.super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFixture_00327680;
  local_660.super_acceptorFixture.super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (Application)&PTR__acceptorFixturenextSequenceResetHelper_003276d8;
  local_660.m_details = details;
  UnitTest::ExecuteTest<SuiteSessionTests::acceptorFixturenextSequenceResetHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture((sessionFixture *)&local_660);
  return;
}

Assistant:

TEST_FIXTURE(acceptorFixture, nextSequenceReset)
{
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );

  // NewSeqNo is greater
  object->next( createSequenceReset( "ISLD", "TW", 0, 3 ), UtcTimeStamp() );
  CHECK_EQUAL( 1, fromSequenceReset );
  CHECK_EQUAL( 3, object->getExpectedTargetNum() );
  CHECK_EQUAL( 0, toReject );

  // NewSeqNo is equal
  object->next( createSequenceReset( "ISLD", "TW", 0, 3 ), UtcTimeStamp() );
  CHECK_EQUAL( 2, fromSequenceReset );
  CHECK_EQUAL( 3, object->getExpectedTargetNum() );
  CHECK_EQUAL( 0, toReject );

  // No MsgSeqNum
  FIX42::SequenceReset sequenceReset = createSequenceReset( "ISLD", "TW", 0, 3 );
  sequenceReset.getHeader().removeField( 34 );
  object->next( sequenceReset, UtcTimeStamp() );
  CHECK_EQUAL( 3, fromSequenceReset );
  CHECK_EQUAL( 3, object->getExpectedTargetNum() );
  CHECK_EQUAL( 0, toReject );

  // NewSeqNo is less
  object->next( createSequenceReset( "ISLD", "TW", 0, 2 ), UtcTimeStamp() );
  CHECK_EQUAL( 4, fromSequenceReset );
  CHECK_EQUAL( 3, object->getExpectedTargetNum() );
  CHECK_EQUAL( 1, toReject );
}